

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  long *plVar1;
  long *plVar2;
  
  mtrace();
  plVar1 = (long *)mpt::io::stream::input::create((streaminfo *)0x0);
  mpt::io::stream::open((char *)(plVar1 + 1),"/dev/stdout");
  plVar2 = plVar1 + 2;
  if (plVar1 == (long *)0x0) {
    plVar2 = (long *)0x0;
  }
  mpt_output_log(plVar2,"main",4,"%s","hallo");
  (**(code **)(plVar1[1] + 0x28))(plVar1 + 1,0xffffffff);
  (**(code **)(*plVar1 + 8))(plVar1);
  return 0;
}

Assistant:

extern int main(int , char * const [])
{
	mtrace();
	
	io::stream::input *out = io::stream::input::create();
	
	out->open("/dev/stdout", "w");
	
	mpt_output_log(out, __FUNCTION__, logger::Warning, "%s", "hallo");
	
	out->sync();
	out->unref();
	
	return 0;
}